

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.c
# Opt level: O1

double p_strtod(pchar *str)

{
  byte bVar1;
  byte bVar2;
  ushort *puVar3;
  bool bVar4;
  byte *mem;
  ushort **ppuVar5;
  uint uVar6;
  long lVar7;
  byte *pbVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_30;
  
  mem = (byte *)p_strchomp(str);
  if (mem == (byte *)0x0) {
    dVar9 = 0.0;
  }
  else {
    dVar9 = 1.0;
    if (*mem == 0x2b) {
      pbVar8 = mem + 1;
    }
    else {
      pbVar8 = mem;
      if (*mem == 0x2d) {
        pbVar8 = mem + 1;
        dVar9 = -1.0;
      }
    }
    ppuVar5 = __ctype_b_loc();
    puVar3 = *ppuVar5;
    bVar1 = *pbVar8;
    lVar7 = (long)(char)bVar1;
    dVar11 = 0.0;
    bVar2 = *(byte *)((long)puVar3 + lVar7 * 2 + 1);
    while ((bVar2 & 8) != 0) {
      dVar11 = dVar11 * 10.0 + (double)((char)lVar7 + -0x30);
      bVar1 = pbVar8[1];
      lVar7 = (long)(char)bVar1;
      pbVar8 = pbVar8 + 1;
      bVar2 = *(byte *)((long)puVar3 + lVar7 * 2 + 1);
    }
    if (bVar1 == 0x2e) {
      lVar7 = (long)(char)pbVar8[1];
      pbVar8 = pbVar8 + 1;
      if ((*(byte *)((long)puVar3 + lVar7 * 2 + 1) & 8) != 0) {
        dVar10 = 10.0;
        do {
          dVar11 = dVar11 + (double)((char)lVar7 + -0x30) / dVar10;
          dVar10 = dVar10 * 10.0;
          lVar7 = (long)(char)pbVar8[1];
          pbVar8 = pbVar8 + 1;
        } while ((*(byte *)((long)puVar3 + lVar7 * 2 + 1) & 8) != 0);
      }
    }
    if ((*pbVar8 | 0x20) == 0x65) {
      bVar4 = false;
      if (pbVar8[1] == 0x2b) {
        pbVar8 = pbVar8 + 2;
      }
      else if (pbVar8[1] == 0x2d) {
        pbVar8 = pbVar8 + 2;
        bVar4 = true;
      }
      else {
        pbVar8 = pbVar8 + 1;
      }
      lVar7 = (long)(char)*pbVar8;
      uVar6 = 0;
      if ((*(byte *)((long)puVar3 + lVar7 * 2 + 1) & 8) != 0) {
        uVar6 = 0;
        do {
          pbVar8 = pbVar8 + 1;
          uVar6 = (uVar6 * 10 + (int)(char)lVar7) - 0x30;
          lVar7 = (long)(char)*pbVar8;
        } while ((*(byte *)((long)puVar3 + lVar7 * 2 + 1) & 8) != 0);
      }
      if (0x134 < uVar6) {
        uVar6 = 0x134;
      }
      local_30 = 1.0;
      for (; 0x31 < uVar6; uVar6 = uVar6 - 0x32) {
        local_30 = local_30 * 1e+50;
      }
      for (; 7 < uVar6; uVar6 = uVar6 - 8) {
        local_30 = local_30 * 100000000.0;
      }
      for (; uVar6 != 0; uVar6 = uVar6 - 1) {
        local_30 = local_30 * 10.0;
      }
    }
    else {
      bVar4 = false;
      local_30 = 1.0;
    }
    p_free(mem);
    if (bVar4) {
      dVar11 = dVar11 / local_30;
    }
    else {
      dVar11 = dVar11 * local_30;
    }
    dVar9 = dVar9 * dVar11;
  }
  return dVar9;
}

Assistant:

P_LIB_API double
p_strtod (const pchar *str)
{
	double		sign;
	double		value;
	double		scale;
	double		pow10;
	puint		expon;
	pint		frac;
	pchar		*orig_str;
	const pchar	*strp;

	orig_str = p_strchomp (str);

	if (P_UNLIKELY (orig_str == NULL))
		return 0.0;

	strp = orig_str;
	sign = 1.0;

	if (*strp == '-') {
		sign = -1.0;
		strp += 1;
	} else if (*strp == '+')
		strp += 1;

	/* Get digits before decimal point or exponent, if any */
	for (value = 0.0; isdigit ((pint) *strp); strp += 1)
		value = value * 10.0 + (*strp - '0');

	/* Get digits after decimal point, if any */
	if (*strp == '.') {
		pow10 = 10.0;
		strp += 1;

		while (isdigit ((pint) *strp)) {
			value += (*strp - '0') / pow10;
			pow10 *= 10.0;
			strp += 1;
		}
	}

	/* Handle exponent, if any */
	frac  = 0;
	scale = 1.0;

	if ((*strp == 'e') || (*strp == 'E')) {
		/* Get sign of exponent, if any */
		strp += 1;

		if (*strp == '-') {
			frac = 1;
			strp += 1;

		} else if (*strp == '+')
			strp += 1;

		/* Get digits of exponent, if any */
		for (expon = 0; isdigit ((pint) *strp); strp += 1)
			expon = expon * 10 + (puint) (*strp - '0');

		if (P_UNLIKELY (expon > P_STR_MAX_EXPON))
			expon = P_STR_MAX_EXPON;

		/* Calculate scaling factor */
		while (expon >= 50) {
			scale *= 1e50;
			expon -= 50;
		}

		while (expon >= 8) {
			scale *= 1e8;
			expon -= 8;
		}

		while (expon > 0) {
			scale *= 10.0;
			expon -= 1;
		}
	}

	p_free (orig_str);

	/* Return signed and scaled floating point result */
	return sign * (frac ? (value / scale) : (value * scale));
}